

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigDialog.cpp
# Opt level: O3

void __thiscall
ConfigDialog::ConfigDialog
          (ConfigDialog *this,Config *config,AudioEnumerator *audio,MidiEnumerator *midi,
          QWidget *parent)

{
  QTabWidget *this_00;
  GeneralConfigTab *pGVar1;
  GeneralConfig *config_00;
  AppearanceConfigTab *pAVar2;
  FontTable *fonts;
  Palette *pal;
  KeyboardConfigTab *pKVar3;
  PianoInput *input;
  ShortcutTable *shortcuts;
  SoundConfigTab *pSVar4;
  MidiConfig *midiConfig;
  SoundConfig *soundConfig;
  QDialogButtonBox *pQVar5;
  QVBoxLayout *this_01;
  undefined4 *puVar6;
  QArrayData *local_98;
  undefined8 local_90;
  code *local_80;
  ImplFn local_78;
  MidiEnumerator *local_70;
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  local_70 = midi;
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001fa1b0;
  *(undefined ***)&this->field_0x10 = &PTR__ConfigDialog_001fa388;
  this->mConfig = config;
  (this->mDirty).i = 0;
  this_00 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_00,(QWidget *)0x0);
  pGVar1 = (GeneralConfigTab *)operator_new(0x50);
  config_00 = Config::general(config);
  GeneralConfigTab::GeneralConfigTab(pGVar1,config_00,(QWidget *)0x0);
  this->mGeneral = pGVar1;
  QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x1b40c8);
  QTabWidget::addTab((QWidget *)this_00,(QString *)pGVar1);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  pAVar2 = (AppearanceConfigTab *)operator_new(0x88);
  fonts = Config::fonts(config);
  pal = Config::palette(config);
  AppearanceConfigTab::AppearanceConfigTab(pAVar2,fonts,pal,(QWidget *)0x0);
  this->mAppearance = pAVar2;
  QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x1b40d0);
  QTabWidget::addTab((QWidget *)this_00,(QString *)pAVar2);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  pKVar3 = (KeyboardConfigTab *)operator_new(0x80);
  input = Config::pianoInput(config);
  shortcuts = Config::shortcuts(config);
  KeyboardConfigTab::KeyboardConfigTab(pKVar3,input,shortcuts,(QWidget *)0x0);
  this->mKeyboard = pKVar3;
  QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x1b40db);
  QTabWidget::addTab((QWidget *)this_00,(QString *)pKVar3);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  pSVar4 = (SoundConfigTab *)operator_new(0x68);
  midiConfig = Config::midi(config);
  soundConfig = Config::sound(config);
  SoundConfigTab::SoundConfigTab(pSVar4,midiConfig,soundConfig,audio,local_70,(QWidget *)0x0);
  this->mSound = pSVar4;
  QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x1b40e4);
  QTabWidget::addTab((QWidget *)this_00,(QString *)pSVar4);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  pQVar5 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar5,0x2400400,1,0);
  this->mButtons = pQVar5;
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01);
  QBoxLayout::addWidget(this_01,this_00,1,0);
  QBoxLayout::addWidget(this_01,this->mButtons,0,0);
  QLayout::setSizeConstraint((SizeConstraint)this_01);
  QWidget::setLayout((QLayout *)this);
  QMetaObject::tr((char *)&local_98,(char *)&staticMetaObject,0x1b40f1);
  QWidget::setWindowTitle((QString *)this);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,2,8);
    }
  }
  QDialog::setModal(SUB81(this,0));
  local_70 = (MidiEnumerator *)QDialogButtonBox::button((StandardButton)this->mButtons);
  QWidget::setEnabled(SUB81(local_70,0));
  pGVar1 = this->mGeneral;
  local_98 = (QArrayData *)ConfigTab::dirty;
  local_90 = 0;
  local_80 = setDirty;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QSlotObject<void_(ConfigDialog::*)(Config::Category),_QtPrivate::List<Config::Category>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = setDirty;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pGVar1,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  pAVar2 = this->mAppearance;
  local_98 = (QArrayData *)ConfigTab::dirty;
  local_90 = 0;
  local_80 = setDirty;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QSlotObject<void_(ConfigDialog::*)(Config::Category),_QtPrivate::List<Config::Category>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = setDirty;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pAVar2,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pKVar3 = this->mKeyboard;
  local_98 = (QArrayData *)ConfigTab::dirty;
  local_90 = 0;
  local_80 = setDirty;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QSlotObject<void_(ConfigDialog::*)(Config::Category),_QtPrivate::List<Config::Category>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = setDirty;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pKVar3,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pSVar4 = this->mSound;
  local_98 = (QArrayData *)ConfigTab::dirty;
  local_90 = 0;
  local_80 = setDirty;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QSlotObject<void_(ConfigDialog::*)(Config::Category),_QtPrivate::List<Config::Category>,_void>
       ::impl;
  *(code **)(puVar6 + 4) = setDirty;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pSVar4,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_98 = (QArrayData *)QAbstractButton::clicked;
  local_90 = 0;
  local_80 = apply;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<bool_(ConfigDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar6 + 4) = apply;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)local_70,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar5 = this->mButtons;
  local_98 = (QArrayData *)QDialogButtonBox::accepted;
  local_90 = 0;
  local_80 = (code *)0x1b9;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<void_(ConfigDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar6 + 4) = 0x1b9;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar5,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar5 = this->mButtons;
  local_98 = (QArrayData *)QDialogButtonBox::rejected;
  local_90 = 0;
  local_80 = (code *)0x1c1;
  local_78 = (ImplFn)0x0;
  puVar6 = (undefined4 *)operator_new(0x20);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::QSlotObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar6 + 4) = 0x1c1;
  *(undefined8 *)(puVar6 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar5,(QObject *)&local_98,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  return;
}

Assistant:

ConfigDialog::ConfigDialog(
    Config &config,
    AudioEnumerator &audio,
    MidiEnumerator &midi,
    QWidget *parent
) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mConfig(config),
    mDirty(Config::CategoryNone)
{


    auto tabs = new QTabWidget;

    mGeneral = new GeneralConfigTab(config.general());
    tabs->addTab(mGeneral, tr("General"));

    mAppearance = new AppearanceConfigTab(config.fonts(), config.palette());
    tabs->addTab(mAppearance, tr("Appearance"));

    mKeyboard = new KeyboardConfigTab(config.pianoInput(), config.shortcuts());
    tabs->addTab(mKeyboard, tr("Keyboard"));

    mSound = new SoundConfigTab(config.midi(), config.sound(), audio, midi);
    tabs->addTab(mSound, tr("Sound / MIDI"));

    mButtons = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel | QDialogButtonBox::Apply, Qt::Horizontal);

    auto layout = new QVBoxLayout;
    layout->addWidget(tabs, 1);
    layout->addWidget(mButtons);
    layout->setSizeConstraint(QLayout::SizeConstraint::SetFixedSize);
    setLayout(layout);

    setWindowTitle(tr("Configuration"));
    setModal(true);

    auto applyButton = mButtons->button(QDialogButtonBox::Apply);
    applyButton->setEnabled(false);

    lazyconnect(mGeneral, dirty, this, setDirty);
    lazyconnect(mAppearance, dirty, this, setDirty);
    lazyconnect(mKeyboard, dirty, this, setDirty);
    lazyconnect(mSound, dirty, this, setDirty);

    lazyconnect(applyButton, clicked, this, apply);
    lazyconnect(mButtons, accepted, this, accept);
    lazyconnect(mButtons, rejected, this, reject);

}